

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O2

void __thiscall
defyx::VmBase<defyx::AlignedAllocator<64UL>,_true>::allocate
          (VmBase<defyx::AlignedAllocator<64UL>,_true> *this)

{
  uint8_t *puVar1;
  invalid_argument *this_00;
  
  if ((this->super_defyx_vm).field_6.cachePtr != (defyx_cache *)0x0) {
    puVar1 = (uint8_t *)AlignedAllocator<64UL>::allocMemory(0x40000);
    (this->super_defyx_vm).scratchpad = puVar1;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Cache/Dataset not set");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void VmBase<Allocator, softAes>::allocate() {
		if (datasetPtr == nullptr)
			throw std::invalid_argument("Cache/Dataset not set");
		if (!softAes) { //if hardware AES is not supported, it's better to fail now than to return a ticking bomb
			rx_vec_i128 tmp = rx_load_vec_i128((const rx_vec_i128*)&aesDummy);
			tmp = rx_aesenc_vec_i128(tmp, tmp);
			rx_store_vec_i128((rx_vec_i128*)&aesDummy, tmp);
		}
		scratchpad = (uint8_t*)Allocator::allocMemory(ScratchpadSize);
	}